

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O0

StickyAtypeParameters * __thiscall OpenMD::StickyAdapter::getStickyParam(StickyAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  StickyAtypeParameters *__src;
  StickyAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> stickyData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *psVar3;
  string *in_stack_ffffffffffffff40;
  errorStruct *in_stack_ffffffffffffff48;
  string local_98 [64];
  string local_58 [48];
  string local_28 [40];
  
  bVar1 = isSticky((StickyAdapter *)0x3823cb);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam was passed an atomType (%s)\n\tthat does not appear to be a Sticky atom.\n"
             ,uVar2);
    std::__cxx11::string::~string(local_28);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_58;
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff48 = &painCave;
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not find Sticky\n\tparameters for atomType %s.\n",
             uVar2);
    std::__cxx11::string::~string(psVar3);
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 2000) = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_98;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not convert\n\tGenericData to StickyAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3825c0);
  __src = SimpleTypeData<OpenMD::StickyAtypeParameters>::getData(this_00);
  memcpy(in_RDI,__src,0x40);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *)0x3825eb);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x3825f8);
  return in_RDI;
}

Assistant:

StickyAtypeParameters StickyAdapter::getStickyParam() {
    if (!isSticky()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Sticky atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(StickyTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not find Sticky\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<StickyAtypeData> stickyData =
        std::dynamic_pointer_cast<StickyAtypeData>(data);
    if (stickyData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not convert\n"
               "\tGenericData to StickyAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return stickyData->getData();
  }